

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O0

double S2::GetApproxArea(S2ShapeIndex *index)

{
  int iVar1;
  undefined4 extraout_var;
  double dVar2;
  S2Shape *shape;
  double dStack_18;
  int i;
  double area;
  S2ShapeIndex *index_local;
  
  dStack_18 = 0.0;
  shape._4_4_ = 0;
  while( true ) {
    iVar1 = (*index->_vptr_S2ShapeIndex[2])();
    if (iVar1 <= (int)shape._4_4_) break;
    iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)shape._4_4_);
    if ((S2Shape *)CONCAT44(extraout_var,iVar1) != (S2Shape *)0x0) {
      dVar2 = GetApproxArea((S2Shape *)CONCAT44(extraout_var,iVar1));
      dStack_18 = dVar2 + dStack_18;
    }
    shape._4_4_ = shape._4_4_ + 1;
  }
  return dStack_18;
}

Assistant:

double GetApproxArea(const S2ShapeIndex& index) {
  double area = 0;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape) area += S2::GetApproxArea(*shape);
  }
  return area;
}